

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstack.h
# Opt level: O2

void __thiscall
TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>::
push_back(TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *object)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)object);
  Push(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void push_back(const T object)
    {
        Push(object);
    }